

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_resolve(char *host,char *buf,size_t n)

{
  int iVar1;
  hostent *phVar2;
  char *pcVar3;
  in_addr __in;
  
  pcVar3 = host;
  phVar2 = gethostbyname(host);
  __in.s_addr = (in_addr_t)pcVar3;
  if (phVar2 == (hostent *)0x0) {
    if (LL_DEBUG < s_cs_log_level) {
      mg_resolve_cold_1();
      __in.s_addr = (in_addr_t)host;
    }
  }
  else {
    __in.s_addr = *(in_addr_t *)*phVar2->h_addr_list;
  }
  if (phVar2 != (hostent *)0x0) {
    pcVar3 = inet_ntoa(__in);
    iVar1 = snprintf(buf,n,"%s",pcVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int mg_resolve(const char *host, char *buf, size_t n) {
    struct in_addr ad;
    return mg_resolve2(host, &ad) ? snprintf(buf, n, "%s", inet_ntoa(ad)) : 0;
}